

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

int Fl_X::ewmh_supported(void)

{
  int iVar1;
  Window WVar2;
  Window child;
  unsigned_long *words;
  unsigned_long nitems;
  
  if (ewmh_supported::result == -1) {
    fl_open_display();
    ewmh_supported::result = 0;
    child = 0;
    WVar2 = XRootWindow(fl_display,fl_screen);
    iVar1 = get_xwinprop(WVar2,fl_NET_SUPPORTING_WM_CHECK,0x40,(unsigned_long *)&words,
                         (unsigned_long **)&child);
    if ((iVar1 == 0) && (words == (unsigned_long *)&DAT_00000001)) {
      WVar2 = *(Window *)child;
      if (child != 0) {
        XFree(child);
        child = 0;
      }
      iVar1 = get_xwinprop(WVar2,fl_NET_SUPPORTING_WM_CHECK,0x40,(unsigned_long *)&words,
                           (unsigned_long **)&child);
      if ((iVar1 == 0) && (words == (unsigned_long *)&DAT_00000001)) {
        ewmh_supported::result = (int)(WVar2 == *(Window *)child);
      }
    }
    if (child != 0) {
      XFree(child);
    }
  }
  return ewmh_supported::result;
}

Assistant:

int Fl_X::ewmh_supported() {
  static int result = -1;

  if (result == -1) {
    fl_open_display();
    result = 0;
    unsigned long nitems;
    unsigned long *words = 0;
    if (0 == get_xwinprop(XRootWindow(fl_display, fl_screen), fl_NET_SUPPORTING_WM_CHECK, 64,
                          &nitems, &words) && nitems == 1) {
      Window child = words[0];
      if ( words ) { XFree(words); words = 0; }
      if (0 == get_xwinprop(child, fl_NET_SUPPORTING_WM_CHECK, 64,
                           &nitems, &words) ) {
        if ( nitems == 1) result = (child == words[0]);
      }
    }
    if ( words ) { XFree(words); words = 0; }
  }

  return result;
}